

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> * __thiscall
lsp::XmlParser::getReferences
          (vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>
           *__return_storage_ptr__,XmlParser *this,ReferenceParams *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ReferenceElement *pRVar3;
  _List_node_base *this_00;
  uint32_t fileIndex;
  ShortnameElement *pSVar4;
  ReferenceElement **ref_1;
  pointer ppRVar5;
  ReferenceElement **ref;
  uint32_t offset;
  shared_ptr<lsp::ArxmlStorage> storage;
  Location res;
  ShortnameElement elem;
  uint32_t local_1ac;
  vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> *local_1a8;
  vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> local_1a0;
  XmlParser local_188;
  value_type local_168;
  string local_110;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  vector<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_> local_68;
  vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_> vStack_50;
  ShortnameElement *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (params->textDocument).uri._M_dataplus._M_p;
  local_1a8 = __return_storage_ptr__;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar2,pcVar2 + (params->textDocument).uri._M_string_length);
  getStorageForUri(&local_188,(DocumentUri *)this);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  this_00 = local_188.storages_.
            super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  pcVar2 = (params->textDocument).uri._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + (params->textDocument).uri._M_string_length);
  fileIndex = ArxmlStorage::getFileIndex((ArxmlStorage *)this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_1ac = ArxmlStorage::getOffsetFromPosition
                        ((ArxmlStorage *)this_00,&params->position,fileIndex);
  local_1ac = local_1ac + 2;
  local_b0._0_8_ = local_b0 + 0x10;
  local_b0._8_8_ = 0;
  local_b0[0x10] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_68.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_50.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_50.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_50.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4 = ArxmlStorage::getShortnameByOffset((ArxmlStorage *)this_00,&local_1ac,fileIndex);
  std::__cxx11::string::_M_assign((string *)local_b0);
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_70._0_4_ = pSVar4->charOffset;
  local_70._4_4_ = pSVar4->fileIndex;
  std::vector<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>::
  operator=(&local_68,&pSVar4->children);
  std::vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
  operator=(&vStack_50,&pSVar4->references);
  local_38 = pSVar4->parent;
  if (config::referenceLinkToParentShortname == '\x01') {
    ArxmlStorage::getReferencesByShortname
              (&local_1a0,
               (ArxmlStorage *)
               local_188.storages_.
               super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
               ._M_impl._M_node.super__List_node_base._M_next,(ShortnameElement *)local_b0);
    if (local_1a0.
        super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a0.
        super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_168.uri.field_2;
      ppRVar5 = local_1a0.
                super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_168.uri._M_string_length = 0;
        local_168.uri.field_2._M_local_buf[0] = '\0';
        local_168.uri._M_dataplus._M_p = (pointer)paVar1;
        ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                  (&local_110,
                   (ArxmlStorage *)
                   local_188.storages_.
                   super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                   ._M_impl._M_node.super__List_node_base._M_next,(*ppRVar5)->fileIndex);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_168.range.start =
             ArxmlStorage::getPositionFromOffset
                       ((ArxmlStorage *)
                        local_188.storages_.
                        super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        (*ppRVar5)->owner->charOffset - 1,(*ppRVar5)->owner->fileIndex);
        pSVar4 = (*ppRVar5)->owner;
        local_168.range.end =
             ArxmlStorage::getPositionFromOffset
                       ((ArxmlStorage *)
                        local_188.storages_.
                        super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        (pSVar4->charOffset - 1) + (int)(pSVar4->name)._M_string_length,
                        pSVar4->fileIndex);
        std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                  (local_1a8,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.uri._M_dataplus._M_p != paVar1) {
          operator_delete(local_168.uri._M_dataplus._M_p,
                          CONCAT71(local_168.uri.field_2._M_allocated_capacity._1_7_,
                                   local_168.uri.field_2._M_local_buf[0]) + 1);
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 !=
               local_1a0.
               super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    ArxmlStorage::getReferencesByShortname
              (&local_1a0,
               (ArxmlStorage *)
               local_188.storages_.
               super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
               ._M_impl._M_node.super__List_node_base._M_next,(ShortnameElement *)local_b0);
    if (local_1a0.
        super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a0.
        super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_168.uri.field_2;
      ppRVar5 = local_1a0.
                super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_168.uri._M_string_length = 0;
        local_168.uri.field_2._M_local_buf[0] = '\0';
        local_168.uri._M_dataplus._M_p = (pointer)paVar1;
        ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                  (&local_110,
                   (ArxmlStorage *)
                   local_188.storages_.
                   super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                   ._M_impl._M_node.super__List_node_base._M_next,(*ppRVar5)->fileIndex);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_168.range.start =
             ArxmlStorage::getPositionFromOffset
                       ((ArxmlStorage *)
                        local_188.storages_.
                        super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                        ._M_impl._M_node.super__List_node_base._M_next,(*ppRVar5)->charOffset - 2,
                        (*ppRVar5)->fileIndex);
        pRVar3 = *ppRVar5;
        local_168.range.end =
             ArxmlStorage::getPositionFromOffset
                       ((ArxmlStorage *)
                        local_188.storages_.
                        super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        (pRVar3->charOffset + (int)(pRVar3->targetPath)._M_string_length) - 1,
                        pRVar3->fileIndex);
        std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                  (local_1a8,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.uri._M_dataplus._M_p != paVar1) {
          operator_delete(local_168.uri._M_dataplus._M_p,
                          CONCAT71(local_168.uri.field_2._M_allocated_capacity._1_7_,
                                   local_168.uri.field_2._M_local_buf[0]) + 1);
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 !=
               local_1a0.
               super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (local_1a0.
      super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_50.
      super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_50.
                    super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_50.
                          super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_50.
                          super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,CONCAT71(local_b0._17_7_,local_b0[0x10]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_188.storages_.
      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
      ._M_impl._M_node.super__List_node_base._M_prev !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_188.storages_.
               super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
               ._M_impl._M_node.super__List_node_base._M_prev);
  }
  return local_1a8;
}

Assistant:

std::vector<lsp::types::Location> lsp::XmlParser::getReferences(const lsp::types::ReferenceParams &params)
{
    std::vector<lsp::types::Location> results;
    
    auto storage = getStorageForUri(params.textDocument.uri);
    uint32_t fileIndex = storage->getFileIndex(params.textDocument.uri);
    uint32_t offset = storage->getOffsetFromPosition(params.position, fileIndex) + 2;
    lsp::ShortnameElement elem;
    try
    {
        elem = storage->getShortnameByOffset(offset, fileIndex);
    }
    catch(const lsp::elementNotFoundException& e)
    {
        auto reference = storage->getReferenceByOffset(offset, fileIndex);
        elem = helper_getShortnameFromInnerPath(storage, reference, offset);
    }

    if(lsp::config::referenceLinkToParentShortname)
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->owner->charOffset - 1, ref->owner->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->owner->charOffset + ref->owner->name.length() - 1, ref->owner->fileIndex);
            results.push_back(res);
        }
    }
    else
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->charOffset - 2, ref->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->charOffset + ref->targetPath.length() - 1, ref->fileIndex);
            results.push_back(res);
        }
    }
    return results;
}